

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void learn(OjaNewton *ON,base_learner *base,example *ec)

{
  update_data_conflict *dat;
  float fVar1;
  example *ec_00;
  int iVar2;
  int k;
  long lVar3;
  int k_1;
  float extraout_XMM0_Da;
  
  predict(ON,base,ec);
  dat = &ON->data;
  (*ON->all->loss->_vptr_loss_function[6])((ec->pred).scalar,(ec->l).simple.label);
  (ON->data).g = extraout_XMM0_Da * (ec->l).simple.weight * 0.5;
  if (ON->normalize == true) {
    GD::foreach_feature<update_data,_float_&,_&update_normalization>(ON->all,ec,dat);
  }
  ON->buffer[ON->cnt] = ec;
  fVar1 = (ON->data).g;
  iVar2 = ON->cnt;
  ON->cnt = iVar2 + 1;
  ON->weight_buffer[iVar2] = fVar1 * 0.5;
  iVar2 = ON->cnt;
  if (iVar2 == ON->epoch_size) {
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      ec_00 = ON->buffer[lVar3];
      (ON->data).sketch_cnt = ON->weight_buffer[lVar3];
      (ON->data).norm2_x = 0.0;
      memset((ON->data).Zx,0,(long)ON->m * 4 + 4);
      GD::foreach_feature<update_data,_float_&,_&compute_Zx_and_norm>(ON->all,ec_00,dat);
      OjaNewton::compute_AZx(ON);
      OjaNewton::update_eigenvalues(ON);
      OjaNewton::compute_delta(ON);
      OjaNewton::update_K(ON);
      GD::foreach_feature<update_data,_float_&,_&update_Z_and_wbar>(ON->all,ec_00,dat);
      ON->t = ON->t + 1;
      iVar2 = ON->epoch_size;
    }
    OjaNewton::update_A(ON);
  }
  memset((ON->data).Zx,0,(long)ON->m * 4 + 4);
  GD::foreach_feature<update_data,_float_&,_&update_wbar_and_Zx>(ON->all,ec,dat);
  OjaNewton::compute_AZx(ON);
  OjaNewton::update_b(ON);
  OjaNewton::check(ON);
  iVar2 = ON->cnt;
  if (iVar2 == ON->epoch_size) {
    ON->cnt = 0;
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      VW::finish_example(ON->all,ON->buffer[lVar3]);
      iVar2 = ON->epoch_size;
    }
  }
  return;
}

Assistant:

void learn(OjaNewton& ON, base_learner& base, example& ec)
{
  assert(ec.in_use);

  // predict
  predict(ON, base, ec);

  update_data& data = ON.data;
  data.g = ON.all->loss->first_derivative(ON.all->sd, ec.pred.scalar, ec.l.simple.label) * ec.l.simple.weight;
  data.g /= 2;  // for half square loss

  if (ON.normalize)
    GD::foreach_feature<update_data, update_normalization>(*ON.all, ec, data);

  ON.buffer[ON.cnt] = &ec;
  ON.weight_buffer[ON.cnt++] = data.g / 2;

  if (ON.cnt == ON.epoch_size)
  {
    for (int k = 0; k < ON.epoch_size; k++, ON.t++)
    {
      example& ex = *(ON.buffer[k]);
      data.sketch_cnt = ON.weight_buffer[k];

      data.norm2_x = 0;
      memset(data.Zx, 0, sizeof(float) * (ON.m + 1));
      GD::foreach_feature<update_data, compute_Zx_and_norm>(*ON.all, ex, data);
      ON.compute_AZx();

      ON.update_eigenvalues();
      ON.compute_delta();

      ON.update_K();

      GD::foreach_feature<update_data, update_Z_and_wbar>(*ON.all, ex, data);
    }

    ON.update_A();
    // ON.update_D();
  }

  memset(data.Zx, 0, sizeof(float) * (ON.m + 1));
  GD::foreach_feature<update_data, update_wbar_and_Zx>(*ON.all, ec, data);
  ON.compute_AZx();

  ON.update_b();
  ON.check();

  if (ON.cnt == ON.epoch_size)
  {
    ON.cnt = 0;
    for (int k = 0; k < ON.epoch_size; k++)
    {
      VW::finish_example(*ON.all, *ON.buffer[k]);
    }
  }
}